

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerCPP::emit_buffer_block(CompilerCPP *this,SPIRVariable *var)

{
  uint32_t uVar1;
  SPIRType *type_00;
  mapped_type *pmVar2;
  spirv_cross local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [8];
  string buffer_name;
  uint32_t local_58 [2];
  uint32_t binding;
  uint32_t local_44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [4];
  uint32_t descriptor_set;
  string instance_name;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerCPP *this_local;
  
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar1);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar1);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_40,this,(ulong)uVar1,1);
  pmVar2 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                        &(var->super_IVariant).self);
  local_44 = (pmVar2->decoration).set;
  pmVar2 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                        &(var->super_IVariant).self);
  local_58[0] = (pmVar2->decoration).binding;
  emit_block_struct(this,type_00);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_78,this,(ulong)uVar1,1);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x23])(local_98,this,type_00);
  CompilerGLSL::
  statement<char_const(&)[20],std::__cxx11::string&,std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[4]>
            (&this->super_CompilerGLSL,(char (*) [20])"internal::Resource<",local_78,local_98,
             (char (*) [3])0x4df6ec,local_40,(char (*) [4])"__;");
  ::std::__cxx11::string::~string((string *)local_98);
  CompilerGLSL::
  statement_no_indent<char_const(&)[9],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&,char_const(&)[9]>
            (&this->super_CompilerGLSL,(char (*) [9])"#define ",local_40,(char (*) [9])" __res->",
             local_40,(char (*) [9])"__.get()");
  join<char_const(&)[21],std::__cxx11::string&,char_const(&)[3],char_const(&)[3],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[3]>
            (local_b8,(char (*) [21])"s.register_resource(",local_40,(char (*) [3])0x4efd8c,
             (char (*) [3])0x4f06f8,&local_44,(char (*) [3])0x4f06f8,local_58,(char (*) [3])0x4d9ce1
            );
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::push_back(&this->resource_registrations,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  ::std::__cxx11::string::~string((string *)local_b8);
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x4d8596);
  ::std::__cxx11::string::~string((string *)local_78);
  ::std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void CompilerCPP::emit_buffer_block(const SPIRVariable &var)
{
	add_resource_name(var.self);

	auto &type = get<SPIRType>(var.basetype);
	auto instance_name = to_name(var.self);

	uint32_t descriptor_set = ir.meta[var.self].decoration.set;
	uint32_t binding = ir.meta[var.self].decoration.binding;

	emit_block_struct(type);
	auto buffer_name = to_name(type.self);

	statement("internal::Resource<", buffer_name, type_to_array_glsl(type), "> ", instance_name, "__;");
	statement_no_indent("#define ", instance_name, " __res->", instance_name, "__.get()");
	resource_registrations.push_back(
	    join("s.register_resource(", instance_name, "__", ", ", descriptor_set, ", ", binding, ");"));
	statement("");
}